

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O2

void emitError(StringRef filename,StringRef message,char *position,uint length,int line,int column,
              StringRef buffer)

{
  uint __line;
  long lVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((position < buffer.Data) || (pcVar6 = buffer.Data + buffer.Length, pcVar6 < position)) {
    pcVar6 = "position >= buffer.begin() && position <= buffer.end() && \"invalid position\"";
    __line = 0x4b;
  }
  else {
    if (position + length <= pcVar6) {
      if (line == -1) {
        line = 1;
        column = 0;
        for (pcVar4 = buffer.Data; pcVar4 != position; pcVar4 = pcVar4 + 1) {
          column = column + 1;
          if (*pcVar4 == '\n') {
            column = 0;
          }
          line = line + (uint)(*pcVar4 == '\n');
        }
      }
      std::ostream::write((char *)&std::cerr,(long)filename.Data);
      poVar3 = std::operator<<((ostream *)&std::cerr,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,column);
      std::operator<<(poVar3,": error: ");
      std::ostream::write((char *)&std::cerr,(long)message.Data);
      std::operator<<((ostream *)&std::cerr,"\n");
      if (pcVar6 != position) {
        lVar1 = 0;
        do {
          lVar7 = lVar1;
          pcVar4 = position;
          if ((position + lVar7 <= buffer.Data) || (position[lVar7 + -1] == '\r')) break;
          lVar1 = lVar7 + -1;
        } while (position[lVar7 + -1] != '\n');
        for (; ((pcVar4 < pcVar6 && (*pcVar4 != '\n')) && (*pcVar4 != '\r')); pcVar4 = pcVar4 + 1) {
        }
        poVar3 = std::operator<<((ostream *)&std::cerr,"  ");
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,position + lVar7,pcVar4);
        poVar3 = std::operator<<(poVar3,(string *)local_50);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::_M_dispose();
        std::operator<<((ostream *)&std::cerr,"  ");
        for (; lVar7 != 0; lVar7 = lVar7 + 1) {
          cVar5 = position[lVar7];
          iVar2 = isspace((int)cVar5);
          if (iVar2 == 0) {
            cVar5 = ' ';
          }
          std::operator<<((ostream *)&std::cerr,cVar5);
        }
        if (length < 2) {
          std::operator<<((ostream *)&std::cerr,'^');
        }
        else {
          while (bVar8 = length != 0, length = length - 1, bVar8) {
            std::operator<<((ostream *)&std::cerr,'~');
          }
        }
        std::operator<<((ostream *)&std::cerr,'\n');
      }
      return;
    }
    pcVar6 = "position + length <= buffer.end() && \"invalid length\"";
    __line = 0x4c;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                ,__line,
                "void emitError(StringRef, StringRef, const char *, unsigned int, int, int, StringRef)"
               );
}

Assistant:

static void emitError(StringRef filename, StringRef message,
                      const char* position, unsigned length,
                      int line, int column,
                      StringRef buffer) {
  assert(position >= buffer.begin() && position <= buffer.end() &&
         "invalid position");
  assert(position + length <= buffer.end() && "invalid length");

  // Compute the line and column, if not provided.
  //
  // FIXME: This is not very efficient, if there are a lot of diagnostics.
  if (line == -1) {
    line = 1;
    column = 0;
    for (const char *c = buffer.begin(); c != position; ++c) {
      if (*c == '\n') {
        ++line;
        column = 0;
      } else {
        ++column;
      }
    }
  }

  std::cerr.write(filename.data(), filename.size());
  std::cerr << ":" << line << ":" << column << ": error: ";
  std::cerr.write(message.data(), message.size());
  std::cerr << "\n";

  // Skip carat diagnostics on EOF token.
  if (position == buffer.end())
    return;

  // Simple caret style diagnostics.
  const char *lineBegin = position, *lineEnd = position;
  const char *bufferBegin = buffer.begin(), *bufferEnd = buffer.end();

  // Run line pointers forward and back.
  while (lineBegin > bufferBegin &&
         lineBegin[-1] != '\r' && lineBegin[-1] != '\n')
    --lineBegin;
  while (lineEnd < bufferEnd &&
         lineEnd[0] != '\r' && lineEnd[0] != '\n')
    ++lineEnd;

  // Show the line, indented by 2.
  std::cerr << "  " << std::string(lineBegin, lineEnd) << "\n";

  // Show the caret or squiggly, making sure to print back spaces the same.
  std::cerr << "  ";
  for (const char* s = lineBegin; s != position; ++s)
    std::cerr << (isspace(*s) ? *s : ' ');
  if (length > 1) {
    for (unsigned i = 0; i != length; ++i)
      std::cerr << '~';
  } else {
    std::cerr << '^';
  }
  std::cerr << '\n';
}